

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::QuerySurfaceCase::checkNonPbufferAttributes
          (QuerySurfaceCase *this,EGLDisplay display,EGLSurface surface)

{
  uint value_00;
  int iVar1;
  Library *pLVar2;
  char *__s;
  ostringstream *poVar3;
  long lVar4;
  EGLint value;
  QuerySurfaceCase *local_1f8;
  TestLog *local_1f0;
  EGLSurface local_1e8;
  Enum<int,_2UL> local_1e0;
  string name;
  undefined1 local_1b0 [384];
  
  local_1e8 = surface;
  pLVar2 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  local_1f0 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
              )->m_log;
  value = -0x2a;
  lVar4 = 0;
  local_1f8 = this;
  do {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    if (lVar4 == 0x14) {
      return;
    }
    value_00 = *(uint *)((long)checkNonPbufferAttributes::pbufferAttribs + lVar4);
    __s = eglu::getSurfaceAttribName(value_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,__s,(allocator<char> *)local_1b0);
    (*pLVar2->_vptr_Library[0x2b])(pLVar2,display,local_1e8,(ulong)value_00,&value);
    iVar1 = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
    if (iVar1 == 0x3000) {
      if (value != -0x2a) {
        local_1b0._0_8_ = local_1f0;
        poVar3 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,
                        "    Fail, return value contents were modified when querying ");
        std::operator<<((ostream *)poVar3,(string *)&name);
        std::operator<<((ostream *)poVar3," from a non-pbuffer surface.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        tcu::TestContext::setTestResult
                  ((local_1f8->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Illegal modification of return value");
      }
    }
    else {
      local_1b0._0_8_ = local_1f0;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"    Fail, querying ");
      std::operator<<((ostream *)poVar3,(string *)&name);
      std::operator<<((ostream *)poVar3,
                      " from a non-pbuffer surface should not result in an error, received ");
      local_1e0.m_getName = eglu::getErrorName;
      local_1e0.m_value = iVar1;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)poVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      tcu::TestContext::setTestResult
                ((local_1f8->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Illegal error condition");
    }
    std::__cxx11::string::~string((string *)&name);
    lVar4 = lVar4 + 4;
  } while (iVar1 == 0x3000);
  return;
}

Assistant:

void QuerySurfaceCase::checkNonPbufferAttributes (EGLDisplay display, EGLSurface surface)
{
	const Library&	egl						= m_eglTestCtx.getLibrary();
	const EGLint	uninitializedMagicValue	= -42;
	tcu::TestLog&	log						= m_testCtx.getLog();
	EGLint			value					= uninitializedMagicValue;

	static const EGLint pbufferAttribs[] =
	{
		EGL_LARGEST_PBUFFER,
		EGL_TEXTURE_FORMAT,
		EGL_TEXTURE_TARGET,
		EGL_MIPMAP_TEXTURE,
		EGL_MIPMAP_LEVEL,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pbufferAttribs); ndx++)
	{
		const EGLint		attribute	= pbufferAttribs[ndx];
		const std::string	name		= eglu::getSurfaceAttribName(pbufferAttribs[ndx]);

		egl.querySurface(display, surface, attribute, &value);

		{
			const EGLint	error	= egl.getError();

			if (error != EGL_SUCCESS)
			{
				log << TestLog::Message << "    Fail, querying " << name << " from a non-pbuffer surface should not result in an error, received "
					<< eglu::getErrorStr(error) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal error condition");
				break;
			}
		}

		// "For a window or pixmap surface, the contents of value are not modified."
		if (value != uninitializedMagicValue)
		{
			log << TestLog::Message << "    Fail, return value contents were modified when querying " << name << " from a non-pbuffer surface." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Illegal modification of return value");
		}
	}
}